

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

void dmrC_vrfy_flow(entrypoint *ep)

{
  undefined1 local_38 [8];
  ptr_list_iter bbiter__;
  basic_block *entry;
  basic_block *bb;
  entrypoint *ep_local;
  
  bbiter__._16_8_ = ep->entry->bb;
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)ep->bbs);
  entry = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_38);
  while (entry != (basic_block *)0x0) {
    if (entry == (basic_block *)bbiter__._16_8_) {
      bbiter__.__nr = 0;
      bbiter__._20_4_ = 0;
    }
    vrfy_bb_flow(entry);
    entry = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_38);
  }
  if (bbiter__._16_8_ == 0) {
    return;
  }
  __assert_fail("!entry",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/flow.c"
                ,0x392,"void dmrC_vrfy_flow(struct entrypoint *)");
}

Assistant:

void dmrC_vrfy_flow(struct entrypoint *ep)
{
	struct basic_block *bb;
	struct basic_block *entry = ep->entry->bb;

	FOR_EACH_PTR(ep->bbs, bb) {
		if (bb == entry)
			entry = NULL;
		vrfy_bb_flow(bb);
	} END_FOR_EACH_PTR(bb);
	assert(!entry);
}